

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::Mine::AddVertexToTripDetonationWire(Mine *this,KUINT16 Index,Vector *Vertex)

{
  iterator iVar1;
  
  iVar1 = getWire(this,Index);
  std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::push_back
            ((vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> *)
             &iVar1._M_node[1]._M_parent,Vertex);
  return;
}

Assistant:

void Mine::AddVertexToTripDetonationWire(KUINT16 Index, const Vector &Vertex) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = getWire( Index );
    itr->second.push_back( Vertex );
}